

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_attributes.c
# Opt level: O1

void read_fare_attributes
               (fare_attributes_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  payment_method_t pVar2;
  transfers_state_t tVar3;
  ulong uVar4;
  char *pcVar5;
  fare_attributes_t *__dest;
  double dVar6;
  
  record->fare_id[0] = '\0';
  record->price = 0.0;
  record->currency_type[0] = '\0';
  record->payment_method = PM_NOT_SET;
  record->transfers = TS_NOT_SET;
  record->agency_id[0] = '\0';
  record->transfer_duration = 0.0;
  if (0 < field_count) {
    uVar4 = 0;
    do {
      pcVar5 = field_names[uVar4];
      iVar1 = strcmp(pcVar5,"fare_id");
      if (iVar1 == 0) {
        pcVar5 = field_values[uVar4];
        __dest = record;
LAB_00105aa0:
        strcpy(__dest->fare_id,pcVar5);
      }
      else {
        iVar1 = strcmp(pcVar5,"price");
        if (iVar1 == 0) {
          dVar6 = atof(field_values[uVar4]);
          record->price = dVar6;
        }
        else {
          iVar1 = strcmp(pcVar5,"currency_type");
          if (iVar1 == 0) {
            pcVar5 = field_values[uVar4];
            __dest = (fare_attributes_t *)record->currency_type;
            goto LAB_00105aa0;
          }
          iVar1 = strcmp(pcVar5,"payment_method");
          if (iVar1 == 0) {
            pVar2 = parse_payment_method(field_values[uVar4]);
            record->payment_method = pVar2;
          }
          else {
            iVar1 = strcmp(pcVar5,"transfers");
            if (iVar1 == 0) {
              tVar3 = parse_transfer_state(field_values[uVar4]);
              record->transfers = tVar3;
            }
            else {
              iVar1 = strcmp(pcVar5,"agency_id");
              if (iVar1 == 0) {
                pcVar5 = field_values[uVar4];
                __dest = (fare_attributes_t *)record->agency_id;
                goto LAB_00105aa0;
              }
              iVar1 = strcmp(pcVar5,"transfer_duration");
              if (iVar1 == 0) {
                dVar6 = strtod(field_values[uVar4],(char **)0x0);
                record->transfer_duration = dVar6;
              }
            }
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while ((uint)field_count != uVar4);
  }
  return;
}

Assistant:

void read_fare_attributes(fare_attributes_t *record, int field_count, const char **field_names, const char **field_values) {
    init_fare_attributes(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "fare_id") == 0) {
            strcpy(record->fare_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "price") == 0) {
            record->price = atof(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "currency_type") == 0) {
            strcpy(record->currency_type, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "payment_method") == 0) {
            record->payment_method = parse_payment_method(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "transfers") == 0) {
            record->transfers = parse_transfer_state(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_id") == 0) {
            strcpy(record->agency_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "transfer_duration") == 0) {
            record->transfer_duration = strtod(field_values[i], NULL);
            continue;
        }
    }
}